

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  unsigned_long uVar1;
  basic_string_view<char> sep;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> out;
  add_thousands_sep<char> sep_00;
  unsigned_long *in_RSI;
  size_t in_RDI;
  undefined8 unaff_retaddr;
  basic_string_view<char> s;
  add_thousands_sep<char> local_78;
  unsigned_long local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  unsigned_long in_stack_ffffffffffffffc0;
  unsigned_long local_38;
  unsigned_long in_stack_ffffffffffffffd0;
  char in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffd9;
  char *in_stack_ffffffffffffffe0;
  size_t in_stack_ffffffffffffffe8;
  
  basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)&stack0xffffffffffffffe0,(char *)(in_RDI + 0xc),1);
  local_60 = *in_RSI;
  local_58 = in_RSI[1];
  local_50 = in_RSI[2];
  uVar1 = in_RSI[3];
  sep.size_ = in_stack_ffffffffffffffe8;
  sep.data_ = in_stack_ffffffffffffffe0;
  internal::add_thousands_sep<char>::add_thousands_sep(&local_78,sep);
  out.super_truncating_iterator_base<char_*>.limit_._0_1_ = in_stack_ffffffffffffffd8;
  out.super_truncating_iterator_base<char_*>.out_ = (char *)in_stack_ffffffffffffffd0;
  out.super_truncating_iterator_base<char_*>.limit_._1_7_ = in_stack_ffffffffffffffd9;
  out.super_truncating_iterator_base<char_*>.count_ = (size_t)in_stack_ffffffffffffffe0;
  out._24_8_ = in_stack_ffffffffffffffe8;
  sep_00.sep_.size_ = in_RDI;
  sep_00.sep_.data_ = (char *)in_RSI;
  sep_00._16_8_ = unaff_retaddr;
  internal::
  format_decimal<char,unsigned_long,fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,fmt::v5::internal::add_thousands_sep<char>>
            (out,in_stack_ffffffffffffffc0,(int)(uVar1 >> 0x20),sep_00);
  *in_RSI = in_stack_ffffffffffffffc0;
  in_RSI[1] = local_38;
  in_RSI[2] = in_stack_ffffffffffffffd0;
  *(char *)(in_RSI + 3) = in_stack_ffffffffffffffd8;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }